

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::CALL(VM *this,u2 index)

{
  uint uVar1;
  size_type sVar2;
  InvalidControlTransfer *pIVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  reference pvVar6;
  int local_7c;
  uint local_78;
  int staticLink;
  int curLv;
  int newLv;
  Context newContext;
  Function *calledFunction;
  u2 index_local;
  VM *this_local;
  
  sVar2 = std::vector<vm::Function,_std::allocator<vm::Function>_>::size(&(this->_file).functions);
  if (sVar2 <= index) {
    pIVar3 = (InvalidControlTransfer *)__cxa_allocate_exception(8);
    InvalidControlTransfer::InvalidControlTransfer(pIVar3);
    __cxa_throw(pIVar3,&InvalidControlTransfer::typeinfo,
                InvalidControlTransfer::~InvalidControlTransfer);
  }
  newContext._56_8_ =
       std::vector<vm::Function,_std::allocator<vm::Function>_>::at
                 (&(this->_file).functions,(ulong)index);
  Context::Context((Context *)&curLv);
  newContext.BP = (addr_t)index;
  pvVar4 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at
                     (&(this->_file).constants,(ulong)*(ushort *)newContext._56_8_);
  pbVar5 = std::get<std::__cxx11::string,std::__cxx11::string,int,double>(&pvVar4->value);
  std::__cxx11::string::operator=((string *)&newContext.staticLink,(string *)pbVar5);
  newContext.functionName.field_2._8_2_ = *(ushort *)(newContext._56_8_ + 4);
  uVar1 = (uint)(ushort)newContext.functionName.field_2._8_2_;
  pvVar6 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::back(&this->_contexts);
  local_78 = (uint)pvVar6->functionLevel;
  if (uVar1 == local_78 + 1) {
    sVar2 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::size(&this->_contexts);
    newContext.prevBP = (int)sVar2 + -1;
  }
  else {
    if (local_78 < uVar1) {
      pIVar3 = (InvalidControlTransfer *)__cxa_allocate_exception(8);
      InvalidControlTransfer::InvalidControlTransfer(pIVar3);
      __cxa_throw(pIVar3,&InvalidControlTransfer::typeinfo,
                  InvalidControlTransfer::~InvalidControlTransfer);
    }
    pvVar6 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::back(&this->_contexts);
    local_7c = pvVar6->staticLink;
    for (; (int)uVar1 < (int)local_78; local_78 = local_78 - 1) {
      pvVar6 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::at
                         (&this->_contexts,(long)local_7c);
      local_7c = pvVar6->staticLink;
    }
    newContext.prevBP = local_7c;
  }
  newContext.prevPC = this->_bp;
  curLv = this->_ip;
  ensureStackUsed(this,(uint)*(ushort *)(newContext._56_8_ + 2));
  this->_bp = this->_sp - (uint)*(ushort *)(newContext._56_8_ + 2);
  newLv = this->_bp;
  newContext.prevSP = this->_bp;
  std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::push_back
            (&this->_contexts,(value_type *)&curLv);
  this->_ip = -1;
  std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::operator=
            (&this->_currentInstructions,
             (vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)(newContext._56_8_ + 8));
  Context::~Context((Context *)&curLv);
  return;
}

Assistant:

void VM::CALL(u2 index) {
    if (0 > index || index >= this->_file.functions.size()) {
        throw InvalidControlTransfer();
    }
    Function& calledFunction = this->_file.functions.at(index);
    Context newContext;
    newContext.functionIndex = index;
    newContext.functionName = std::get<str_t>(this->_file.constants.at(calledFunction.nameIndex).value);

    newContext.functionLevel = calledFunction.level;
    int newLv = newContext.functionLevel;
    int curLv = _contexts.back().functionLevel;
    if (newLv == curLv + 1) {
        newContext.staticLink = _contexts.size()-1;
    }
    else if (newLv <= curLv) {
        int staticLink = _contexts.back().staticLink;
        for (; curLv > newLv; --curLv) {
            staticLink = _contexts.at(staticLink).staticLink;
        }
        newContext.staticLink = staticLink;
    }
    else {
        throw InvalidControlTransfer();
    }
    newContext.prevBP = this->_bp;
    newContext.prevPC = this->_ip;
    ensureStackUsed(calledFunction.paramSize);
    this->_bp = this->_sp - calledFunction.paramSize;
    newContext.prevSP = this->_bp;
    newContext.BP = this->_bp;
    _contexts.push_back(newContext);
    this->_ip = -1;
    this->_currentInstructions = calledFunction.instructions;
}